

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# square_tm.hpp
# Opt level: O3

exp_number __thiscall
ising::free_energy::square::transfer_matrix<double>::product_U
          (transfer_matrix<double> *this,uint_t Ly,real_t Jx,real_t beta,exp_number *factor,
          vector<double,_std::allocator<double>_> *v,vector<double,_std::allocator<double>_> *v_10,
          vector<double,_std::allocator<double>_> *v_20,
          vector<double,_std::allocator<double>_> *v_01,
          vector<double,_std::allocator<double>_> *v_02,vector<double,_std::allocator<double>_> *vt)

{
  pointer pdVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  uint_t uVar7;
  ulong uVar8;
  pointer pdVar9;
  uint_t c0;
  ulong uVar10;
  uint_t c0_1;
  ulong uVar11;
  ulong uVar12;
  double dVar13;
  double dVar14;
  value_type_conflict extraout_XMM0_Qa;
  exp_number eVar15;
  exp_number<double> local_40;
  
  uVar12 = (ulong)(1 << ((byte)Ly & 0x1f));
  dVar13 = exp(Jx * beta);
  dVar14 = exp(-beta * Jx);
  if (Ly != 0) {
    pdVar9 = (vt->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar7 = 0;
    do {
      uVar8 = (ulong)(1 << ((byte)uVar7 & 0x1f));
      pdVar1 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar2 = (v_10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar3 = (v_20->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar10 = 0;
      do {
        uVar11 = uVar10 ^ uVar8;
        pdVar9[uVar10] =
             pdVar3[uVar10] * dVar13 + pdVar3[uVar11] * dVar14 +
             (pdVar1[uVar10] * dVar13 + pdVar1[uVar11] * dVar14) * Jx * Jx +
             (pdVar2[uVar10] * dVar13 + pdVar2[uVar11] * -dVar14) * (Jx + Jx);
        uVar10 = uVar10 + 1;
      } while (uVar12 != uVar10);
      pdVar1 = (v_20->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      pdVar2 = (v_20->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      (v_20->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_start = pdVar9;
      pdVar9 = (vt->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      (v_20->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish = (vt->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
      (v_20->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage = pdVar9;
      (vt->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_start = pdVar3;
      (vt->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish = pdVar1;
      (vt->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage = pdVar2;
      pdVar9 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar4 = (v_10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar10 = 0;
      do {
        pdVar3[uVar10] =
             (pdVar9[uVar10] * dVar13 + pdVar9[uVar10 ^ uVar8] * -dVar14) * Jx +
             pdVar4[uVar10] * dVar13 + pdVar4[uVar10 ^ uVar8] * dVar14;
        uVar10 = uVar10 + 1;
      } while (uVar12 != uVar10);
      pdVar9 = (v_10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      pdVar5 = (v_10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      (v_10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_start = pdVar3;
      (v_10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish = pdVar1;
      (v_10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage = pdVar2;
      (vt->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_start = pdVar4;
      (vt->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish = pdVar9;
      (vt->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage = pdVar5;
      pdVar1 = (v_02->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar10 = 0;
      do {
        pdVar4[uVar10] = pdVar1[uVar10] * dVar13 + pdVar1[uVar10 ^ uVar8] * dVar14;
        uVar10 = uVar10 + 1;
      } while (uVar12 != uVar10);
      pdVar2 = (v_02->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      pdVar3 = (v_02->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      (v_02->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_start = pdVar4;
      (v_02->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish = pdVar9;
      (v_02->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage = pdVar5;
      (vt->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_start = pdVar1;
      (vt->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish = pdVar2;
      (vt->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage = pdVar3;
      pdVar4 = (v_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar10 = 0;
      do {
        pdVar1[uVar10] = pdVar4[uVar10] * dVar13 + pdVar4[uVar10 ^ uVar8] * dVar14;
        uVar10 = uVar10 + 1;
      } while (uVar12 != uVar10);
      pdVar5 = (v_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      pdVar6 = (v_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      (v_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_start = pdVar1;
      (v_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish = pdVar2;
      (v_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage = pdVar3;
      (vt->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_start = pdVar4;
      (vt->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish = pdVar5;
      (vt->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage = pdVar6;
      pdVar9 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar10 = 0;
      do {
        pdVar4[uVar10] = pdVar9[uVar10] * dVar13 + pdVar9[uVar10 ^ uVar8] * dVar14;
        uVar10 = uVar10 + 1;
      } while (uVar12 != uVar10);
      (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_start = pdVar4;
      (vt->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_start = pdVar9;
      pdVar1 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      pdVar2 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish = pdVar5;
      (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage = pdVar6;
      (vt->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish = pdVar1;
      (vt->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage = pdVar2;
      uVar7 = uVar7 + 1;
    } while (uVar7 != Ly);
  }
  dVar13 = 0.0;
  uVar8 = 0;
  do {
    dVar14 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start[uVar8];
    dVar13 = dVar13 + dVar14 * dVar14;
    uVar8 = uVar8 + 1;
  } while (uVar12 != uVar8);
  if (dVar13 < 0.0) {
    dVar13 = sqrt(dVar13);
  }
  else {
    dVar13 = SQRT(dVar13);
  }
  dVar13 = 1.0 / dVar13;
  pdVar9 = (v_20->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar1 = (v_10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (v_02->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (v_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar4 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  uVar8 = 0;
  do {
    pdVar9[uVar8] = pdVar9[uVar8] * dVar13;
    pdVar1[uVar8] = pdVar1[uVar8] * dVar13;
    pdVar2[uVar8] = pdVar2[uVar8] * dVar13;
    pdVar3[uVar8] = pdVar3[uVar8] * dVar13;
    pdVar4[uVar8] = pdVar4[uVar8] * dVar13;
    uVar8 = uVar8 + 1;
  } while (uVar12 != uVar8);
  *(value_type_conflict *)this = factor->log_;
  *(int32_t *)(this + 8) = factor->sign_;
  standards::exp_number<double>::exp_number(&local_40,dVar13);
  standards::exp_number<double>::operator/=((exp_number<double> *)this,&local_40);
  eVar15._8_8_ = this;
  eVar15.log_ = extraout_XMM0_Qa;
  return eVar15;
}

Assistant:

static exp_number product_U(uint_t Ly, real_t Jx, real_t beta,
                              exp_number factor, std::vector<real_t> &v,
                              std::vector<real_t> &v_10,
                              std::vector<real_t> &v_20,
                              std::vector<real_t> &v_01,
                              std::vector<real_t> &v_02,
                              std::vector<real_t> &vt) {
    uint_t dim = 1 << Ly;
    boost::array<double, 2> weight;
    weight[0] = std::exp(beta * Jx);
    weight[1] = std::exp(-beta * Jx);
    for (uint_t s = 0; s < Ly; ++s) {
      for (uint_t c0 = 0; c0 < dim; ++c0) {
        uint_t c1 = c0 ^ (1 << s);
        vt[c0] = Jx * Jx * (weight[0] * v[c0] + weight[1] * v[c1]) +
                 2 * Jx * (weight[0] * v_10[c0] - weight[1] * v_10[c1]) +
                 (weight[0] * v_20[c0] + weight[1] * v_20[c1]);
      }
      std::swap(v_20, vt);
      for (uint_t c0 = 0; c0 < dim; ++c0) {
        uint_t c1 = c0 ^ (1 << s);
        vt[c0] = Jx * (weight[0] * v[c0] - weight[1] * v[c1]) +
                 (weight[0] * v_10[c0] + weight[1] * v_10[c1]);
      }
      std::swap(v_10, vt);
      for (uint_t c0 = 0; c0 < dim; ++c0) {
        uint_t c1 = c0 ^ (1 << s);
        vt[c0] = (weight[0] * v_02[c0] + weight[1] * v_02[c1]);
      }
      std::swap(v_02, vt);
      for (uint_t c0 = 0; c0 < dim; ++c0) {
        uint_t c1 = c0 ^ (1 << s);
        vt[c0] = (weight[0] * v_01[c0] + weight[1] * v_01[c1]);
      }
      std::swap(v_01, vt);
      for (uint_t c0 = 0; c0 < dim; ++c0) {
        uint_t c1 = c0 ^ (1 << s);
        vt[c0] = weight[0] * v[c0] + weight[1] * v[c1];
      }
      std::swap(v, vt);
    }
    real_t norm2 = 0;
    for (uint_t c = 0; c < dim; ++c) {
      norm2 += v[c] * v[c];
    }
    real_t norm_inv = 1 / std::sqrt(norm2);
    for (uint_t c = 0; c < dim; ++c) {
      v_20[c] *= norm_inv;
      v_10[c] *= norm_inv;
      v_02[c] *= norm_inv;
      v_01[c] *= norm_inv;
      v[c] *= norm_inv;
    }
    return factor / norm_inv;
  }